

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_rt_speed_feature_framesize_dependent(AV1_COMP *cpi,SPEED_FEATURES *sf,int speed)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int i_1;
  RTC_REF *rtc_ref;
  int i;
  int is_360p_or_larger;
  int is_480p_or_larger;
  int is_720p_or_larger;
  int is_1080p_or_larger;
  int boosted;
  AV1_COMMON *cm;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa1;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  int in_stack_ffffffffffffffa4;
  byte local_57;
  byte local_56;
  byte local_55;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_38;
  
  iVar2 = frame_is_boosted((AV1_COMP *)0x30c89c);
  if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
    local_48 = (int)in_RDI[0x77f7];
  }
  else {
    local_48 = *(int *)((long)in_RDI + 0x3bfbc);
  }
  if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
    local_4c = (int)in_RDI[0x77f7];
  }
  else {
    local_4c = *(int *)((long)in_RDI + 0x3bfbc);
  }
  if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
    local_50 = (int)in_RDI[0x77f7];
  }
  else {
    local_50 = *(int *)((long)in_RDI + 0x3bfbc);
  }
  if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
    local_54 = (int)in_RDI[0x77f7];
  }
  else {
    local_54 = *(int *)((long)in_RDI + 0x3bfbc);
  }
  if (0x167 < local_54) {
    *(undefined1 *)(in_RSI + 0x4c8) = 2;
    *(undefined4 *)(in_RSI + 0x300) = 1;
    if (in_EDX < 6) {
      uVar3 = 0x15e;
      if (iVar2 != 0) {
        uVar3 = 0x7fffffff;
      }
      *(undefined4 *)(in_RSI + 800) = uVar3;
      uVar3 = 2;
      if (iVar2 != 0) {
        uVar3 = 0;
      }
      *(undefined4 *)(in_RSI + 0x390) = uVar3;
    }
    if (in_EDX == 6) {
      *(undefined4 *)(in_RSI + 0x124) = 1;
    }
    if (5 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4ac) = 2;
    }
    if ((in_EDX == 7) && (*(undefined4 *)(in_RSI + 0x43c) = 1, (int)in_RDI[0xc10e] == 0)) {
      if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
        in_stack_ffffffffffffffa4 = (int)in_RDI[0x77f7];
      }
      else {
        in_stack_ffffffffffffffa4 = *(int *)((long)in_RDI + 0x3bfbc);
      }
      if ((in_stack_ffffffffffffffa4 < 0x2d1) && ((*(byte *)((long)in_RDI + 0x42773) & 1) == 0)) {
        *(uint *)(in_RSI + 0x24) = (uint)((char)in_RDI[0x8480] == '\0');
      }
    }
    if (6 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4d8) = 1;
    }
    if ((in_EDX == 8) && (*(int *)(*in_RDI + 0xc750) == 0)) {
      *(undefined4 *)(in_RSI + 0x40c) = 0;
      *(undefined4 *)(in_RSI + 0x3f4) = 1;
    }
    if (7 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x500) = 2;
    }
    if (8 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4b0) = 1;
      *(undefined4 *)(in_RSI + 0x490) = 1;
      *(undefined4 *)(in_RSI + 0x4f8) = 2;
      *(undefined4 *)(in_RSI + 0x4c0) = 2;
      *(undefined1 *)(in_RSI + 0x51c) = 1;
      *(undefined4 *)(in_RSI + 0x290) = 1;
    }
    if (9 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x420) = 2;
      *(undefined4 *)(in_RSI + 0x4f8) = 4;
      *(undefined4 *)(in_RSI + 0x500) = 0;
      *(undefined4 *)(in_RSI + 0x4c0) = 3;
      *(undefined1 *)(in_RSI + 0x51c) = 0;
      *(undefined4 *)(in_RSI + 0x290) = 2;
    }
  }
  else {
    *(undefined1 *)(in_RSI + 0x4c8) = 1;
    *(undefined4 *)(in_RSI + 0x4b8) = 1;
    if (5 < in_EDX) {
      uVar3 = 2;
      if (iVar2 != 0) {
        uVar3 = 0;
      }
      *(undefined4 *)(in_RSI + 0x390) = uVar3;
    }
    if (in_EDX == 7) {
      *(undefined4 *)(in_RSI + 0x43c) = 2;
    }
    if (6 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x3a4) = 6;
      *(undefined1 *)(in_RSI + 0x511) = 1;
      *(undefined4 *)(in_RSI + 0x4d8) = 2;
    }
    if (in_EDX == 8) {
      *(undefined4 *)(in_RSI + 0x43c) = 1;
    }
    if (7 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x418) = 1;
      *(undefined4 *)(in_RSI + 0x500) = 1;
    }
    if (8 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x3f8) = 0;
      *(undefined4 *)(in_RSI + 0x48c) = 1;
      *(undefined4 *)(in_RSI + 0x3d8) = 1;
      local_55 = 0;
      if (*(int *)(in_RSI + 0x3f4) == 0) {
        local_56 = 1;
        if (*(int *)(in_RSI + 0x3f8) != 0) {
          local_57 = 0;
          if (*(int *)(in_RSI + 0x400) == 0) {
            local_57 = *(int *)(in_RSI + 0x404) != 0 ^ 0xff;
          }
          local_56 = local_57;
        }
        local_55 = local_56;
      }
      *(byte *)(in_RSI + 0x51d) = local_55 & 1;
      *(undefined1 *)(in_RSI + 0x51c) = 0;
    }
    if (9 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x3dc) = 0;
      *(undefined4 *)(in_RSI + 0x3d8) = 2;
      *(undefined4 *)(in_RSI + 0x420) = 3;
      *(undefined4 *)(in_RSI + 0x4c4) = 1;
      *(undefined4 *)(in_RSI + 0x4c0) = 2;
      *(undefined4 *)(in_RSI + 0x418) = 0;
    }
  }
  if ((local_50 < 0x1e0) && (in_EDX == 7)) {
    *(undefined4 *)(in_RSI + 0x3e0) = 2;
  }
  if (local_4c < 0x2d0) {
    if (8 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x49c) = 1;
    }
  }
  else {
    if (5 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4ac) = 3;
    }
    if (in_EDX == 7) {
      *(undefined4 *)(in_RSI + 0x43c) = 0;
    }
    if (6 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4c4) = 2;
      *(undefined4 *)(in_RSI + 0x4c0) = 1;
    }
    if (8 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4f8) = 1;
      *(undefined4 *)(in_RSI + 0x4c4) = 0;
      *(undefined4 *)(in_RSI + 0x4c0) = 2;
    }
    if (9 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4f8) = 3;
      *(undefined4 *)(in_RSI + 0x4c0) = 3;
    }
  }
  if (local_48 < 0x438) {
    if (8 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x3a4) = 6;
    }
    if (9 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x48c) = 1;
    }
  }
  else {
    if (6 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4c0) = 0;
      *(undefined1 *)(in_RSI + 0x51c) = 0;
    }
    if (8 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x290) = 0;
    }
  }
  if ((10 < in_EDX) && (*(int *)((long)in_RDI + 0x4269c) != 1)) {
    *(undefined4 *)(in_RSI + 0x490) = 1;
    *(undefined4 *)(in_RSI + 0x498) = 1;
    *(undefined4 *)(in_RSI + 0x494) = 1;
    *(undefined4 *)(in_RSI + 0x418) = 0;
    if (0x167 < local_54) {
      *(undefined1 *)(in_RSI + 0x91) = 9;
      *(undefined4 *)(in_RSI + 0x4a0) = 1;
      *(undefined4 *)(in_RSI + 0x4c4) = 2;
    }
    *(undefined4 *)(in_RSI + 0x4a4) = 1;
    *(undefined4 *)(in_RSI + 0x4f0) = 2;
    *(undefined4 *)(in_RSI + 0x518) = 2;
    for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
      *(undefined4 *)(in_RSI + 0x448 + (long)local_38 * 4) = 1;
    }
    *(undefined4 *)(in_RSI + 0x420) = 0;
  }
  if ((*(int *)(*in_RDI + 0xc750) != 0) || (*(int *)(*in_RDI + 0x14dc0) != 0)) {
    lVar1 = *in_RDI;
    if (((1 < *(int *)((long)in_RDI + 0x9d33c)) && (*(int *)((long)in_RDI + 0x9d334) == 0)) &&
       (((int)in_RDI[0x13a66] == 0 ||
        ((int)in_RDI[0x8467] * *(int *)((long)in_RDI + 0x4233c) < 0x38401)))) {
      *(undefined1 *)(in_RSI + 0x128) = 1;
      *(undefined1 *)(in_RSI + 0x134) = 1;
      *(undefined4 *)(in_RSI + 0x444) = 10;
      *(undefined4 *)(in_RSI + 0x4c0) = 0;
      if ((int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc) < 0x18c01) {
        *(undefined4 *)(in_RSI + 0x3ec) = 2;
      }
      *(undefined4 *)(in_RSI + 0x49c) = 0;
    }
    if (7 < in_EDX) {
      if (2 < *(int *)((long)in_RDI + 0x9d33c)) {
        *(undefined1 *)(in_RSI + 0x512) = 1;
      }
      *(undefined4 *)(in_RSI + 0x4c0) = 3;
      if (*(int *)(lVar1 + 0x14dc4) != 0) {
        *(undefined4 *)(in_RSI + 0x48c) = 1;
        *(undefined1 *)(in_RSI + 0x134) = 2;
      }
    }
    if (((in_EDX < 10) && (2 < *(int *)((long)in_RDI + 0x9d33c))) &&
       (*(int *)((long)in_RDI + 0x9d334) == 0)) {
      *(undefined1 *)(in_RSI + 0x511) = 0;
    }
    else {
      *(undefined1 *)(in_RSI + 0x511) = 1;
    }
    *(undefined1 *)(in_RSI + 0x50d) = 0;
    if (((*(int *)(lVar1 + 0x14dc8) == 0) && (*(int *)(lVar1 + 0x14dcc) == 0)) &&
       (*(int *)(lVar1 + 0x14dd0) == 0)) {
      *(undefined4 *)(in_RSI + 0x3f8) = 0;
    }
    else {
      *(undefined4 *)(in_RSI + 0x3f8) = 1;
      in_stack_ffffffffffffffa3 = false;
      if (*(int *)(lVar1 + 0x14dc8) != 0) {
        in_stack_ffffffffffffffa3 = *(int *)(lVar1 + 0x14d74) != 0;
      }
      *(uint *)(in_RSI + 0x3fc) = (uint)(byte)in_stack_ffffffffffffffa3;
      in_stack_ffffffffffffffa2 = false;
      if (*(int *)(lVar1 + 0x14dcc) != 0) {
        in_stack_ffffffffffffffa2 = *(int *)(lVar1 + 0x14d6c) != 0;
      }
      *(uint *)(in_RSI + 0x400) = (uint)(byte)in_stack_ffffffffffffffa2;
      in_stack_ffffffffffffffa1 = false;
      if (*(int *)(lVar1 + 0x14dd0) != 0) {
        in_stack_ffffffffffffffa1 = *(int *)(lVar1 + 0x14d80) != 0;
      }
      *(uint *)(in_RSI + 0x404) = (uint)(byte)in_stack_ffffffffffffffa1;
    }
    if ((1 < (int)in_RDI[0x13a67]) || (1 < *(int *)((long)in_RDI + 0x9d33c))) {
      *(undefined4 *)(in_RSI + 0x24) = 0;
    }
    *(undefined4 *)(in_RSI + 0x3dc) = 1;
    if ((*(byte *)(*in_RDI + 0x14e01) & 1) != 0) {
      *(undefined1 *)(in_RSI + 0x128) = 1;
      *(undefined1 *)(in_RSI + 0x134) = 0;
      *(undefined4 *)(in_RSI + 0x444) = 8;
      *(undefined4 *)(in_RSI + 0x48c) = 0;
    }
  }
  if (*(int *)((long)in_RDI + 0x4269c) == 1) {
    if (6 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4c0) = 1;
      *(undefined4 *)(in_RSI + 300) = 0;
      *(undefined4 *)(in_RSI + 0x490) = 1;
      *(undefined1 *)(in_RSI + 0x51f) = 1;
      iVar2 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
      if (iVar2 == 0) {
        *(undefined4 *)(in_RSI + 0x4e4) = 1;
      }
    }
    if (7 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x3e0) = 3;
      *(undefined4 *)(in_RSI + 0x3ec) = 1;
      *(undefined4 *)(in_RSI + 0x418) = 0;
      *(undefined1 *)(in_RSI + 0x488) = 0;
    }
    if (8 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4e0) = 1;
      *(undefined4 *)(in_RSI + 0x4f0) = 2;
      *(undefined4 *)(in_RSI + 0x4e8) = 1;
      *(undefined4 *)(in_RSI + 0x3ec) = 3;
      *(undefined4 *)(in_RSI + 0x4cc) = 10;
      *(undefined1 *)(in_RSI + 0x134) = 2;
      *(undefined4 *)(in_RSI + 0x4c0) = 3;
      *(undefined4 *)(in_RSI + 0x4c4) = 1;
      *(undefined4 *)(in_RSI + 0x3a4) = 6;
      *(undefined4 *)(in_RSI + 0x3e0) = 0;
      *(undefined4 *)(in_RSI + 0x290) = 0;
    }
    if (9 < in_EDX) {
      if (0x1fa400 < (int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc)) {
        *(undefined4 *)(in_RSI + 0x124) = 1;
      }
      *(undefined4 *)(in_RSI + 0x508) = 0x50;
      *(undefined4 *)(in_RSI + 0x4f0) = 1;
      *(undefined4 *)(in_RSI + 0x48c) = 1;
      *(undefined4 *)(in_RSI + 0x4ec) = 0x5a;
      *(undefined4 *)(in_RSI + 0x420) = 0;
      *(undefined4 *)(in_RSI + 0x4e4) = 1;
      *(undefined4 *)(in_RSI + 0x424) = 1;
      *(undefined1 *)(in_RSI + 0x510) = 1;
      *(undefined4 *)(in_RSI + 0x52c) = 1;
      *(undefined4 *)(in_RSI + 0x438) = 1;
    }
    if (10 < in_EDX) {
      *(undefined4 *)(in_RSI + 0x4e8) = 2;
      *(undefined4 *)(in_RSI + 0x490) = 2;
      *(undefined4 *)(in_RSI + 0x424) = 2;
      *(undefined1 *)(in_RSI + 0x51f) = 0;
      *(undefined1 *)(in_RSI + 0x50e) = 1;
      *(undefined1 *)(in_RSI + 0x50f) = 1;
    }
    if ((((0xb < in_EDX) && ((int)in_RDI[0xc0f6] != 0)) && (40000 < (ulong)in_RDI[0xc0f9])) &&
       (((ulong)in_RDI[0xc0f8] < 1000 &&
        (0xe0fff < (int)in_RDI[0x8467] * *(int *)((long)in_RDI + 0x4233c))))) {
      *(undefined4 *)(in_RSI + 0x424) = 3;
      *(undefined4 *)(in_RSI + 0x530) = 1;
    }
    *(uint *)(in_RSI + 0x528) = (uint)(0 < *(int *)((long)in_RDI + 0x423c4));
    *(undefined4 *)(in_RSI + 0x524) = 1;
    *(undefined4 *)(in_RSI + 0x4dc) = 1;
    *(undefined4 *)(in_RSI + 0x520) = 0;
    *(undefined4 *)(in_RSI + 0x3f4) = 0;
    *(undefined4 *)(in_RSI + 0x4d8) = 0;
    *(undefined4 *)(in_RSI + 0x3f8) = 0;
    *(undefined4 *)(in_RSI + 0x428) = 1;
    if ((int)in_RDI[0xc0f6] == 1) {
      *(undefined4 *)(in_RSI + 0x43c) = 0;
      *(undefined1 *)(in_RSI + 0xe4) = 0xf;
      for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
        if (local_44 < 10) {
          *(undefined4 *)(in_RSI + 0x448 + (long)local_44 * 4) = 7;
        }
        else {
          *(undefined4 *)(in_RSI + 0x448 + (long)local_44 * 4) = 1;
        }
      }
    }
    if ((in_EDX < 0xb) || (*(int *)((long)in_RDI + 0x607b4) == 0)) {
      if (((20000 < (ulong)in_RDI[0xc10b]) && ((100 < (ulong)in_RDI[0xc0f9] && (5 < in_EDX)))) &&
         ((1 < (int)in_RDI[0xc10a] || ((*(byte *)((long)in_RDI + 0x9d4b4) & 1) != 0)))) {
        *(undefined1 *)(in_RSI + 0x128) = 1;
        *(undefined4 *)(in_RSI + 0x444) = 2;
      }
    }
    else {
      *(undefined4 *)(in_RSI + 0x520) = 1;
      *(undefined4 *)(in_RSI + 0x498) = 1;
      *(undefined4 *)(in_RSI + 0x418) = 0;
      *(undefined1 *)(in_RSI + 0x91) = 9;
      *(undefined4 *)(in_RSI + 0x4a0) = 1;
      *(undefined4 *)(in_RSI + 0x4a4) = 1;
      *(undefined4 *)(in_RSI + 0x494) = 1;
      *(undefined1 *)(in_RSI + 0x128) = 8;
    }
    if (((int)in_RDI[0xc0f6] != 0) && (*(int *)(*in_RDI + 0x14dc4) != 0)) {
      *(undefined4 *)(in_RSI + 0x4dc) = 0;
      *(undefined4 *)(in_RSI + 0x43c) = 1;
      *(undefined1 *)(in_RSI + 0x134) = 2;
      *(undefined4 *)(in_RSI + 0x444) = 10;
    }
    *(undefined4 *)(in_RSI + 0x4fc) = 0;
    *(undefined4 *)(in_RSI + 0x24) = 0;
    if (*(int *)(in_RSI + 0x3f0) == 0) {
      *(undefined4 *)(in_RSI + 0x3dc) = 0;
    }
    else {
      *(undefined4 *)(in_RSI + 0x3dc) = 1;
    }
  }
  iVar2 = is_lossless_requested((RateControlCfg *)(in_RDI + 0x8472));
  if (iVar2 != 0) {
    *(undefined4 *)(in_RSI + 0x4d8) = 0;
    *(undefined4 *)(in_RSI + 0x24) = 0;
  }
  if ((*(byte *)((long)in_RDI + 0x42773) & 1) != 0) {
    *(undefined4 *)(in_RSI + 0x3dc) = 0;
  }
  if ((*(byte *)((long)in_RDI + 0x4241c) & 1) != 0) {
    *(undefined4 *)(in_RSI + 0x4d8) = 0;
    *(undefined4 *)(in_RSI + 0x3ec) = 1;
  }
  iVar2 = is_psnr_calc_enabled
                    ((AV1_COMP *)
                     CONCAT44(in_stack_ffffffffffffffa4,
                              CONCAT13(in_stack_ffffffffffffffa3,
                                       CONCAT12(in_stack_ffffffffffffffa2,
                                                CONCAT11(in_stack_ffffffffffffffa1,
                                                         in_stack_ffffffffffffffa0)))));
  if ((iVar2 != 0) &&
     (((int)in_RDI[0x8467] != (int)in_RDI[0x77f7] ||
      (*(int *)((long)in_RDI + 0x4233c) != *(int *)((long)in_RDI + 0x3bfbc))))) {
    *(undefined4 *)(in_RSI + 0x4d8) = 0;
  }
  return;
}

Assistant:

static void set_rt_speed_feature_framesize_dependent(const AV1_COMP *const cpi,
                                                     SPEED_FEATURES *const sf,
                                                     int speed) {
  const AV1_COMMON *const cm = &cpi->common;
  const int boosted = frame_is_boosted(cpi);
  const int is_1080p_or_larger = AOMMIN(cm->width, cm->height) >= 1080;
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  const int is_360p_or_larger = AOMMIN(cm->width, cm->height) >= 360;

  if (!is_360p_or_larger) {
    sf->rt_sf.prune_intra_mode_based_on_mv_range = 1;
    sf->rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad = 1;
    if (speed >= 6)
      sf->winner_mode_sf.prune_winner_mode_eval_level = boosted ? 0 : 2;
    if (speed == 7) sf->rt_sf.prefer_large_partition_blocks = 2;
    if (speed >= 7) {
      sf->lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
      sf->rt_sf.check_only_zero_zeromv_on_large_blocks = true;
      sf->rt_sf.use_rtc_tf = 2;
    }
    if (speed == 8) sf->rt_sf.prefer_large_partition_blocks = 1;
    if (speed >= 8) {
      sf->rt_sf.use_nonrd_filter_search = 1;
      sf->rt_sf.tx_size_level_based_on_qstep = 1;
    }
    if (speed >= 9) {
      sf->rt_sf.use_comp_ref_nonrd = 0;
      sf->rt_sf.nonrd_aggressive_skip = 1;
      sf->rt_sf.skip_intra_pred = 1;
      // Only turn on enable_ref_short_signaling for low resolution when only
      // LAST and GOLDEN ref frames are used.
      sf->rt_sf.enable_ref_short_signaling =
          (!sf->rt_sf.use_nonrd_altref_frame &&
           (!sf->rt_sf.use_comp_ref_nonrd ||
            (!sf->rt_sf.ref_frame_comp_nonrd[1] &&
             !sf->rt_sf.ref_frame_comp_nonrd[2])));

// TODO(kyslov) Re-enable when AV1 models are trained
#if 0
#if CONFIG_RT_ML_PARTITIONING
      if (!frame_is_intra_only(cm)) {
        sf->part_sf.partition_search_type = ML_BASED_PARTITION;
        sf->rt_sf.reuse_inter_pred_nonrd = 0;
      }
#endif
#endif
      sf->rt_sf.use_adaptive_subpel_search = false;
    }
    if (speed >= 10) {
      // TODO(yunqingwang@google.com): To be conservative, disable
      // sf->rt_sf.estimate_motion_for_var_based_partition = 3 for speed 10/qvga
      // for now. May enable it in the future.
      sf->rt_sf.estimate_motion_for_var_based_partition = 0;
      sf->rt_sf.skip_intra_pred = 2;
      sf->rt_sf.hybrid_intra_pickmode = 3;
      sf->rt_sf.reduce_mv_pel_precision_lowcomplex = 1;
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 2;
      sf->rt_sf.use_nonrd_filter_search = 0;
    }
  } else {
    sf->rt_sf.prune_intra_mode_based_on_mv_range = 2;
    sf->intra_sf.skip_filter_intra_in_inter_frames = 1;
    if (speed <= 5) {
      sf->tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh =
          boosted ? INT_MAX : 350;
      sf->winner_mode_sf.prune_winner_mode_eval_level = boosted ? 0 : 2;
    }
    if (speed == 6) sf->part_sf.disable_8x8_part_based_on_qidx = 1;
    if (speed >= 6) sf->rt_sf.skip_newmv_mode_based_on_sse = 2;
    if (speed == 7) {
      sf->rt_sf.prefer_large_partition_blocks = 1;
      // Enable this feature for [360p, 720p] resolution range initially.
      // Only enable for low bitdepth to mitigate issue: b/303023614.
      if (!cpi->rc.rtc_external_ratectrl &&
          AOMMIN(cm->width, cm->height) <= 720 && !cpi->oxcf.use_highbitdepth)
        sf->hl_sf.accurate_bit_estimate = cpi->oxcf.q_cfg.aq_mode == NO_AQ;
    }
    if (speed >= 7) {
      sf->rt_sf.use_rtc_tf = 1;
    }
    if (speed == 8 && !cpi->ppi->use_svc) {
      sf->rt_sf.short_circuit_low_temp_var = 0;
      sf->rt_sf.use_nonrd_altref_frame = 1;
    }
    if (speed >= 8) sf->rt_sf.tx_size_level_based_on_qstep = 2;
    if (speed >= 9) {
      sf->rt_sf.gf_length_lvl = 1;
      sf->rt_sf.skip_cdef_sb = 1;
      sf->rt_sf.sad_based_adp_altref_lag = 2;
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 2;
      sf->rt_sf.use_adaptive_subpel_search = true;
      sf->interp_sf.cb_pred_filter_search = 1;
    }
    if (speed >= 10) {
      sf->rt_sf.hybrid_intra_pickmode = 2;
      sf->rt_sf.sad_based_adp_altref_lag = 4;
      sf->rt_sf.tx_size_level_based_on_qstep = 0;
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 3;
      sf->rt_sf.use_adaptive_subpel_search = false;
      sf->interp_sf.cb_pred_filter_search = 2;
    }
  }
  if (!is_480p_or_larger) {
    if (speed == 7) {
      sf->rt_sf.nonrd_check_partition_merge_mode = 2;
    }
  }
  if (!is_720p_or_larger) {
    if (speed >= 9) {
      sf->rt_sf.force_large_partition_blocks_intra = 1;
    }
  } else {
    if (speed >= 6) sf->rt_sf.skip_newmv_mode_based_on_sse = 3;
    if (speed == 7) sf->rt_sf.prefer_large_partition_blocks = 0;
    if (speed >= 7) {
      sf->rt_sf.reduce_mv_pel_precision_lowcomplex = 2;
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 1;
    }
    if (speed >= 9) {
      sf->rt_sf.sad_based_adp_altref_lag = 1;
      sf->rt_sf.reduce_mv_pel_precision_lowcomplex = 0;
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 2;
    }
    if (speed >= 10) {
      sf->rt_sf.sad_based_adp_altref_lag = 3;
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 3;
    }
  }
  // TODO(Any): Check/Tune settings of other sfs for 1080p.
  if (is_1080p_or_larger) {
    if (speed >= 7) {
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 0;
      sf->rt_sf.use_adaptive_subpel_search = 0;
    }
    if (speed >= 9) sf->interp_sf.cb_pred_filter_search = 0;
  } else {
    if (speed >= 9) sf->lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
    if (speed >= 10) sf->rt_sf.nonrd_aggressive_skip = 1;
  }
  // TODO(marpan): Tune settings for speed 11 video mode,
  if (speed >= 11 && cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN) {
    sf->rt_sf.skip_cdef_sb = 1;
    sf->rt_sf.force_only_last_ref = 1;
    sf->rt_sf.selective_cdf_update = 1;
    sf->rt_sf.use_nonrd_filter_search = 0;
    if (is_360p_or_larger) {
      sf->part_sf.fixed_partition_size = BLOCK_32X32;
      sf->rt_sf.use_fast_fixed_part = 1;
      sf->rt_sf.reduce_mv_pel_precision_lowcomplex = 2;
    }
    sf->rt_sf.increase_source_sad_thresh = 1;
    sf->rt_sf.part_early_exit_zeromv = 2;
    sf->rt_sf.set_zeromv_skip_based_on_source_sad = 2;
    for (int i = 0; i < BLOCK_SIZES; ++i) {
      sf->rt_sf.intra_y_mode_bsize_mask_nrd[i] = INTRA_DC;
    }
    sf->rt_sf.hybrid_intra_pickmode = 0;
  }
  // Setting for SVC, or when the ref_frame_config control is
  // used to set the reference structure.
  if (cpi->ppi->use_svc || cpi->ppi->rtc_ref.set_ref_frame_config) {
    const RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
    // For SVC: for greater than 2 temporal layers, use better mv search on
    // base temporal layers, and only on base spatial layer if highest
    // resolution is above 640x360.
    if (cpi->svc.number_temporal_layers >= 2 &&
        cpi->svc.temporal_layer_id == 0 &&
        (cpi->svc.spatial_layer_id == 0 ||
         cpi->oxcf.frm_dim_cfg.width * cpi->oxcf.frm_dim_cfg.height <=
             640 * 360)) {
      sf->mv_sf.search_method = NSTEP;
      sf->mv_sf.subpel_search_method = SUBPEL_TREE_PRUNED;
      sf->rt_sf.fullpel_search_step_param = 10;
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 0;
      if (cm->width * cm->height <= 352 * 288)
        sf->rt_sf.nonrd_prune_ref_frame_search = 2;
      sf->rt_sf.force_large_partition_blocks_intra = 0;
    }
    if (speed >= 8) {
      if (cpi->svc.number_temporal_layers > 2)
        sf->rt_sf.disable_cdf_update_non_reference_frame = true;
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 3;
      if (rtc_ref->non_reference_frame) {
        sf->rt_sf.nonrd_aggressive_skip = 1;
        sf->mv_sf.subpel_search_method = SUBPEL_TREE_PRUNED_MORE;
      }
    }
    if (speed <= 9 && cpi->svc.number_temporal_layers > 2 &&
        cpi->svc.temporal_layer_id == 0)
      sf->rt_sf.check_only_zero_zeromv_on_large_blocks = false;
    else
      sf->rt_sf.check_only_zero_zeromv_on_large_blocks = true;
    sf->rt_sf.frame_level_mode_cost_update = false;

    // Compound mode enabling.
    if (rtc_ref->ref_frame_comp[0] || rtc_ref->ref_frame_comp[1] ||
        rtc_ref->ref_frame_comp[2]) {
      sf->rt_sf.use_comp_ref_nonrd = 1;
      sf->rt_sf.ref_frame_comp_nonrd[0] =
          rtc_ref->ref_frame_comp[0] && rtc_ref->reference[GOLDEN_FRAME - 1];
      sf->rt_sf.ref_frame_comp_nonrd[1] =
          rtc_ref->ref_frame_comp[1] && rtc_ref->reference[LAST2_FRAME - 1];
      sf->rt_sf.ref_frame_comp_nonrd[2] =
          rtc_ref->ref_frame_comp[2] && rtc_ref->reference[ALTREF_FRAME - 1];
    } else {
      sf->rt_sf.use_comp_ref_nonrd = 0;
    }

    if (cpi->svc.number_spatial_layers > 1 ||
        cpi->svc.number_temporal_layers > 1)
      sf->hl_sf.accurate_bit_estimate = 0;

    sf->rt_sf.estimate_motion_for_var_based_partition = 1;

    // For single layers RPS: bias/adjustment for recovery frame.
    if (cpi->ppi->rtc_ref.bias_recovery_frame) {
      sf->mv_sf.search_method = NSTEP;
      sf->mv_sf.subpel_search_method = SUBPEL_TREE;
      sf->rt_sf.fullpel_search_step_param = 8;
      sf->rt_sf.nonrd_aggressive_skip = 0;
    }
  }
  // Screen settings.
  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
    // TODO(marpan): Check settings for speed 7 and 8.
    if (speed >= 7) {
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 1;
      sf->mv_sf.use_bsize_dependent_search_method = 0;
      sf->rt_sf.skip_cdef_sb = 1;
      sf->rt_sf.increase_color_thresh_palette = 1;
      if (!frame_is_intra_only(cm)) sf->rt_sf.dct_only_palette_nonrd = 1;
    }
    if (speed >= 8) {
      sf->rt_sf.nonrd_check_partition_merge_mode = 3;
      sf->rt_sf.nonrd_prune_ref_frame_search = 1;
      sf->rt_sf.use_nonrd_filter_search = 0;
      sf->rt_sf.prune_hv_pred_modes_using_src_sad = false;
    }
    if (speed >= 9) {
      sf->rt_sf.prune_idtx_nonrd = 1;
      sf->rt_sf.part_early_exit_zeromv = 2;
      sf->rt_sf.skip_lf_screen = 1;
      sf->rt_sf.nonrd_prune_ref_frame_search = 3;
      sf->rt_sf.var_part_split_threshold_shift = 10;
      sf->mv_sf.subpel_search_method = SUBPEL_TREE_PRUNED_MORE;
      sf->rt_sf.reduce_mv_pel_precision_highmotion = 3;
      sf->rt_sf.reduce_mv_pel_precision_lowcomplex = 1;
      sf->lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
      sf->rt_sf.nonrd_check_partition_merge_mode = 0;
      sf->interp_sf.cb_pred_filter_search = 0;
    }
    if (speed >= 10) {
      if (cm->width * cm->height > 1920 * 1080)
        sf->part_sf.disable_8x8_part_based_on_qidx = 1;
      sf->rt_sf.screen_content_cdef_filter_qindex_thresh = 80;
      sf->rt_sf.part_early_exit_zeromv = 1;
      sf->rt_sf.nonrd_aggressive_skip = 1;
      sf->rt_sf.thresh_active_maps_skip_lf_cdef = 90;
      sf->rt_sf.hybrid_intra_pickmode = 0;
      sf->rt_sf.dct_only_palette_nonrd = 1;
      sf->rt_sf.prune_palette_search_nonrd = 1;
      sf->rt_sf.prune_intra_mode_using_best_sad_so_far = true;
      sf->rt_sf.rc_faster_convergence_static = 1;
      sf->rt_sf.rc_compute_spatial_var_sc = 1;
    }
    if (speed >= 11) {
      sf->rt_sf.skip_lf_screen = 2;
      sf->rt_sf.skip_cdef_sb = 2;
      sf->rt_sf.prune_palette_search_nonrd = 2;
      sf->rt_sf.increase_color_thresh_palette = 0;
      sf->rt_sf.prune_h_pred_using_best_mode_so_far = true;
      sf->rt_sf.enable_intra_mode_pruning_using_neighbors = true;
    }
    if (speed >= 12) {
      if (cpi->rc.high_source_sad && cpi->rc.frame_source_sad > 40000 &&
          cpi->rc.prev_avg_source_sad < 1000 &&
          cpi->oxcf.frm_dim_cfg.width * cpi->oxcf.frm_dim_cfg.height >=
              1280 * 720) {
        sf->rt_sf.prune_palette_search_nonrd = 3;
        sf->rt_sf.skip_newmv_mode_sad_screen = 1;
      }
    }
    sf->rt_sf.skip_encoding_non_reference_slide_change =
        cpi->oxcf.rc_cfg.drop_frames_water_mark > 0 ? 1 : 0;
    sf->rt_sf.skip_newmv_flat_blocks_screen = 1;
    sf->rt_sf.use_idtx_nonrd = 1;
    sf->rt_sf.higher_thresh_scene_detection = 0;
    sf->rt_sf.use_nonrd_altref_frame = 0;
    sf->rt_sf.use_rtc_tf = 0;
    sf->rt_sf.use_comp_ref_nonrd = 0;
    sf->rt_sf.source_metrics_sb_nonrd = 1;
    if (cpi->rc.high_source_sad == 1) {
      sf->rt_sf.prefer_large_partition_blocks = 0;
      sf->part_sf.max_intra_bsize = BLOCK_128X128;
      for (int i = 0; i < BLOCK_SIZES; ++i) {
        if (i > BLOCK_32X32)
          sf->rt_sf.intra_y_mode_bsize_mask_nrd[i] = INTRA_DC;
        else
          sf->rt_sf.intra_y_mode_bsize_mask_nrd[i] = INTRA_DC_H_V;
      }
    }
    if (speed >= 11 && cpi->rc.high_motion_content_screen_rtc) {
      sf->rt_sf.higher_thresh_scene_detection = 1;
      sf->rt_sf.force_only_last_ref = 1;
      sf->rt_sf.use_nonrd_filter_search = 0;
      sf->part_sf.fixed_partition_size = BLOCK_32X32;
      sf->rt_sf.use_fast_fixed_part = 1;
      sf->rt_sf.increase_source_sad_thresh = 1;
      sf->rt_sf.selective_cdf_update = 1;
      sf->mv_sf.search_method = FAST_DIAMOND;
    } else if (cpi->rc.max_block_source_sad > 20000 &&
               cpi->rc.frame_source_sad > 100 && speed >= 6 &&
               (cpi->rc.percent_blocks_with_motion > 1 ||
                cpi->svc.last_layer_dropped[0])) {
      sf->mv_sf.search_method = NSTEP;
      sf->rt_sf.fullpel_search_step_param = 2;
    }
    if (cpi->rc.high_source_sad && cpi->ppi->rtc_ref.non_reference_frame) {
      sf->rt_sf.use_idtx_nonrd = 0;
      sf->rt_sf.prefer_large_partition_blocks = 1;
      sf->mv_sf.subpel_search_method = SUBPEL_TREE_PRUNED_MORE;
      sf->rt_sf.fullpel_search_step_param = 10;
    }
    sf->rt_sf.partition_direct_merging = 0;
    sf->hl_sf.accurate_bit_estimate = 0;
    // This feature is for nonrd_pickmode.
    if (sf->rt_sf.use_nonrd_pick_mode)
      sf->rt_sf.estimate_motion_for_var_based_partition = 1;
    else
      sf->rt_sf.estimate_motion_for_var_based_partition = 0;
  }
  if (is_lossless_requested(&cpi->oxcf.rc_cfg)) {
    sf->rt_sf.use_rtc_tf = 0;
    // TODO(aomedia:3412): The setting accurate_bit_estimate = 0
    // can be removed once it's fixed for lossless mode.
    sf->hl_sf.accurate_bit_estimate = 0;
  }
  if (cpi->oxcf.use_highbitdepth) {
    // Disable for use_highbitdepth = 1 to mitigate issue: b/303023614.
    sf->rt_sf.estimate_motion_for_var_based_partition = 0;
  }
  if (cpi->oxcf.superres_cfg.enable_superres) {
    sf->rt_sf.use_rtc_tf = 0;
    sf->rt_sf.nonrd_prune_ref_frame_search = 1;
  }
  // rtc_tf feature allocates new source because of possible
  // temporal filtering which may change the input source during encoding:
  // this causes an issue on resized frames when psnr is calculated,
  // so disable it here for frames that are resized (encoding width/height
  // different from configured width/height).
  if (is_psnr_calc_enabled(cpi) && (cpi->oxcf.frm_dim_cfg.width != cm->width ||
                                    cpi->oxcf.frm_dim_cfg.height != cm->height))
    sf->rt_sf.use_rtc_tf = 0;
}